

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map_Chest::Update(Map_Chest *this,Map *map,Character *exclude)

{
  int num;
  Character *this_00;
  uint uVar1;
  uint uVar2;
  const_iterator __end1;
  uint uVar3;
  _List_node_base *p_Var4;
  PacketBuilder builder;
  
  PacketBuilder::PacketBuilder
            (&builder,PACKET_CHEST,PACKET_AGREE,
             (this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl
             ._M_node._M_size * 5);
  p_Var4 = (_List_node_base *)&this->items;
  while (p_Var4 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->items) {
    num = *(int *)((long)&p_Var4[1]._M_next + 4);
    PacketBuilder::AddShort(&builder,(int)*(short *)&p_Var4[1]._M_next);
    PacketBuilder::AddThree(&builder,num);
  }
  p_Var4 = (_List_node_base *)&map->characters;
  while (p_Var4 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&map->characters) {
    this_00 = (Character *)p_Var4[1]._M_next;
    if (this_00 != exclude) {
      uVar1 = (uint)this_00->x - (uint)this->x;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar2 = (uint)this_00->y - (uint)this->y;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      if ((uVar1 & 0xff) + (uVar3 & 0xff) < 2) {
        Character::Send(this_00,&builder);
      }
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map_Chest::Update(Map *map, Character *exclude) const
{
	PacketBuilder builder(PACKET_CHEST, PACKET_AGREE, this->items.size() * 5);

	UTIL_FOREACH(this->items, item)
	{
		builder.AddShort(item.id);
		builder.AddThree(item.amount);
	}

	UTIL_FOREACH(map->characters, character)
	{
		if (character == exclude)
		{
			continue;
		}

		if (util::path_length(character->x, character->y, this->x, this->y) <= 1)
		{
			character->Send(builder);
		}
	}
}